

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * duckdb::ToJsonMapInternal
                   (string *__return_storage_ptr__,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *map,yyjson_mut_doc *doc,yyjson_mut_val *root)

{
  yyjson_mut_doc *doc_00;
  yyjson_mut_doc *extraout_RDX;
  
  doc_00 = (yyjson_mut_doc *)(map->_M_h)._M_before_begin._M_nxt;
  if (doc_00 != (yyjson_mut_doc *)0x0) {
    ToJsonMapInternal();
    doc_00 = extraout_RDX;
  }
  WriteJsonToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc_00);
  return __return_storage_ptr__;
}

Assistant:

string ToJsonMapInternal(const unordered_map<string, string> &map, yyjson_mut_doc *doc, yyjson_mut_val *root) {
	for (auto &entry : map) {
		auto key = yyjson_mut_strncpy(doc, entry.first.c_str(), entry.first.size());
		auto value = yyjson_mut_strncpy(doc, entry.second.c_str(), entry.second.size());
		yyjson_mut_obj_add(root, key, value);
	}
	return WriteJsonToString(doc);
}